

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ci.cpp
# Opt level: O0

void msd_ci<unsigned_short>(uchar **strings,size_t n,size_t depth)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  uchar *puVar4;
  void *__ptr;
  ulong local_288;
  size_t i_4;
  size_t bsum;
  distblock<unsigned_char> tmp2;
  size_t backup_idx;
  distblock<unsigned_char> tmp;
  size_t i_3;
  uint i_2;
  unsigned_short last_bucket_size;
  size_t i_1;
  size_t i;
  uchar *oracle;
  unsigned_short bucketsize [256];
  size_t depth_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
  }
  else {
    memset(&oracle,0,0x200);
    __ptr = malloc(n);
    for (i_1 = 0; i_1 < n; i_1 = i_1 + 1) {
      *(uchar *)((long)__ptr + i_1) = strings[i_1][depth];
    }
    for (_i_2 = 0; _i_2 < n; _i_2 = _i_2 + 1) {
      bucketsize[(ulong)*(byte *)((long)__ptr + _i_2) - 4] =
           bucketsize[(ulong)*(byte *)((long)__ptr + _i_2) - 4] + 1;
    }
    msd_ci<unsigned_short>::bucketindex[0] = (ssize_t)(ushort)oracle;
    i_3._6_2_ = (ushort)oracle;
    for (i_3._0_4_ = 1; (uint)i_3 < 0x100; i_3._0_4_ = (uint)i_3 + 1) {
      msd_ci<unsigned_short>::bucketindex[(uint)i_3] =
           msd_ci<unsigned_short>::bucketindex[(uint)i_3 - 1] +
           (ulong)bucketsize[(ulong)(uint)i_3 - 4];
      if (bucketsize[(ulong)(uint)i_3 - 4] != 0) {
        i_3._6_2_ = bucketsize[(ulong)(uint)i_3 - 4];
      }
    }
    tmp.bucket = '\0';
    tmp._9_7_ = 0;
    for (; (ulong)tmp._8_8_ < n - i_3._6_2_;
        tmp._8_8_ = (ulong)bucketsize[(long)(tmp.ptr + -4)] + tmp._8_8_) {
      backup_idx = (size_t)strings[tmp._8_8_];
      bVar1 = *(byte *)((long)__ptr + tmp._8_8_);
      while( true ) {
        tmp.ptr = (uchar *)(ulong)bVar1;
        lVar3 = msd_ci<unsigned_short>::bucketindex[(long)tmp.ptr];
        msd_ci<unsigned_short>::bucketindex[(long)tmp.ptr] = lVar3 + -1;
        if (lVar3 + -1 <= (long)tmp._8_8_) break;
        lVar3 = msd_ci<unsigned_short>::bucketindex[(long)tmp.ptr];
        puVar4 = strings[lVar3];
        bVar2 = *(byte *)((long)__ptr + lVar3);
        strings[lVar3] = (uchar *)backup_idx;
        *(byte *)((long)__ptr + lVar3) = bVar1;
        backup_idx = (size_t)puVar4;
        bVar1 = bVar2;
      }
      strings[tmp._8_8_] = (uchar *)backup_idx;
    }
    free(__ptr);
    i_4 = (size_t)(ushort)oracle;
    for (local_288 = 1; local_288 < 0x100; local_288 = local_288 + 1) {
      if (bucketsize[local_288 - 4] != 0) {
        msd_ci<unsigned_short>(strings + i_4,(ulong)bucketsize[local_288 - 4],depth + 1);
        i_4 = bucketsize[local_288 - 4] + i_4;
      }
    }
  }
  return;
}

Assistant:

static void
msd_ci(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	BucketsizeType bucketsize[256] = {0};
	unsigned char* restrict oracle =
		(unsigned char*) malloc(n);
	for (size_t i=0; i < n; ++i)
		oracle[i] = strings[i][depth];
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	static ssize_t bucketindex[256];
	bucketindex[0] = bucketsize[0];
	BucketsizeType last_bucket_size = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		bucketindex[i] = bucketindex[i-1] + bucketsize[i];
		if (bucketsize[i]) last_bucket_size = bucketsize[i];
	}
	for (size_t i=0; i < n-last_bucket_size; ) {
		distblock<uint8_t> tmp = { strings[i], oracle[i] };
		while (1) {
			// Continue until the current bucket is completely in
			// place
			if (--bucketindex[tmp.bucket] <= ssize_t(i))
				break;
			// backup all information of the position we are about
			// to overwrite
			size_t backup_idx = bucketindex[tmp.bucket];
			distblock<uint8_t> tmp2 = { strings[backup_idx], oracle[backup_idx] };
			// overwrite everything, ie. move the string to correct
			// position
			strings[backup_idx] = tmp.ptr;
			oracle[backup_idx]  = tmp.bucket;
			tmp = tmp2;
		}
		// Commit last pointer to place. We don't need to copy the
		// oracle entry, it's not read after this.
		strings[i] = tmp.ptr;
		i += bucketsize[tmp.bucket];
	}
	free(oracle);
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_ci<BucketsizeType>(strings+bsum, bucketsize[i], depth+1);
		bsum += bucketsize[i];
	}
}